

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O0

void __thiscall QtMWidgets::PageViewPrivate::movePageLeft(PageViewPrivate *this,int delta)

{
  PageControl *this_00;
  int iVar1;
  int iVar2;
  QRect local_34;
  QRect local_24;
  int local_14;
  PageViewPrivate *pPStack_10;
  int delta_local;
  PageViewPrivate *this_local;
  
  local_14 = delta;
  pPStack_10 = this;
  if ((this->pagesPrepared & 1U) == 0) {
    local_24 = QWidget::rect(this->viewport);
    preparePages(this,&local_24);
  }
  iVar1 = PageControl::currentIndex(this->control);
  iVar2 = PageControl::count(this->control);
  if ((iVar1 < iVar2 + -1) || (0 < this->pagesOffset)) {
    this->pagesOffset = this->pagesOffset - local_14;
    iVar1 = qAbs<int>(&this->pagesOffset);
    iVar2 = QWidget::width(this->viewport);
    if (iVar1 < iVar2) {
      movePages(this);
    }
    else {
      local_34 = QWidget::rect(this->viewport);
      invalidatePages(this,&local_34);
      this_00 = this->control;
      iVar1 = PageControl::currentIndex(this->control);
      PageControl::setCurrentIndex(this_00,iVar1 + 1);
    }
  }
  return;
}

Assistant:

void
PageViewPrivate::movePageLeft( int delta )
{
	if( !pagesPrepared )
		preparePages( viewport->rect() );

	if( control->currentIndex() < control->count() - 1 || pagesOffset > 0 )
	{
		pagesOffset -= delta;

		if( qAbs( pagesOffset ) < viewport->width() )
			movePages();
		else
		{
			invalidatePages( viewport->rect() );

			control->setCurrentIndex( control->currentIndex() + 1 );
		}
	}
}